

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall
xatlas::internal::BitImage::resize(BitImage *this,uint32_t w,uint32_t h,bool discard)

{
  uint uVar1;
  undefined7 in_register_00000009;
  uint uVar2;
  uint uVar3;
  size_t __n;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ArrayBase local_50;
  ulong local_38;
  
  uVar4 = w + 0x3f >> 6;
  if ((int)CONCAT71(in_register_00000009,discard) == 0) {
    local_50.buffer = (uint8_t *)0x0;
    local_50.elementSize = 8;
    local_50.capacity = 0;
    local_50.size = uVar4 * h;
    if (local_50.size == 0) {
      __n = 0;
    }
    else {
      ArrayBase::setArrayCapacity(&local_50,local_50.size);
      __n = (ulong)local_50.size << 3;
    }
    local_38 = (ulong)w;
    memset(local_50.buffer,0,__n);
    if (uVar4 == this->m_rowStride) {
      uVar2 = this->m_height;
      if (h <= this->m_height) {
        uVar2 = h;
      }
      memcpy(local_50.buffer,(this->m_data).m_base.buffer,(ulong)(uVar2 * uVar4) << 3);
    }
    else if ((this->m_width != 0) && (uVar2 = this->m_height, h != 0 && uVar2 != 0)) {
      if (h <= uVar2) {
        uVar2 = h;
      }
      uVar5 = 0;
      uVar6 = 0;
      do {
        if (local_50.size <= uVar5) {
LAB_001b9527:
          __assert_fail("index < m_base.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x4ae,
                        "T &xatlas::internal::Array<unsigned long>::operator[](uint32_t) [T = unsigned long]"
                       );
        }
        uVar3 = this->m_rowStride;
        uVar1 = (int)uVar6 * uVar3;
        if ((this->m_data).m_base.size <= uVar1) goto LAB_001b9527;
        if (uVar4 < uVar3) {
          uVar3 = uVar4;
        }
        memcpy(local_50.buffer + (ulong)uVar5 * 8,(this->m_data).m_base.buffer + (ulong)uVar1 * 8,
               (ulong)(uVar3 << 3));
        uVar6 = uVar6 + 1;
        uVar5 = uVar5 + uVar4;
      } while (uVar2 != uVar6);
    }
    ArrayBase::moveTo(&local_50,&(this->m_data).m_base);
    w = (uint32_t)local_38;
    ArrayBase::~ArrayBase(&local_50);
  }
  else {
    uVar2 = uVar4 * h;
    (this->m_data).m_base.size = uVar2;
    if ((this->m_data).m_base.capacity < uVar2) {
      ArrayBase::setArrayCapacity(&(this->m_data).m_base,uVar2);
      uVar2 = (this->m_data).m_base.size;
    }
    memset((this->m_data).m_base.buffer,0,(ulong)(uVar2 * (this->m_data).m_base.elementSize));
  }
  this->m_width = w;
  this->m_height = h;
  this->m_rowStride = uVar4;
  return;
}

Assistant:

void resize(uint32_t w, uint32_t h, bool discard)
	{
		const uint32_t rowStride = (w + 63) >> 6;
		if (discard) {
			m_data.resize(rowStride * h);
			m_data.zeroOutMemory();
		} else {
			Array<uint64_t> tmp;
			tmp.resize(rowStride * h);
			memset(tmp.data(), 0, tmp.size() * sizeof(uint64_t));
			// If only height has changed, can copy all rows at once.
			if (rowStride == m_rowStride) {
				memcpy(tmp.data(), m_data.data(), m_rowStride * min(m_height, h) * sizeof(uint64_t));
			} else if (m_width > 0 && m_height > 0) {
				const uint32_t height = min(m_height, h);
				for (uint32_t i = 0; i < height; i++)
					memcpy(&tmp[i * rowStride], &m_data[i * m_rowStride], min(rowStride, m_rowStride) * sizeof(uint64_t));
			}
			tmp.moveTo(m_data);
		}
		m_width = w;
		m_height = h;
		m_rowStride = rowStride;
	}